

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

void __thiscall CaDiCaL::Options::print(Options *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  int iVar57;
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  int iVar84;
  int iVar85;
  int iVar86;
  int iVar87;
  int iVar88;
  int iVar89;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  int iVar102;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  int iVar107;
  int iVar108;
  int iVar109;
  char *pcVar110;
  char *pcVar111;
  char *pcVar112;
  char *pcVar113;
  uint uVar114;
  int iVar115;
  char *pcVar116;
  char *pcVar117;
  char *pcVar118;
  int iVar119;
  char buffer [256];
  
  iVar119 = this->arena;
  if (iVar119 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar119 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--arena=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->arena == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar115 = this->arenacompact;
  uVar114 = (iVar119 != 1) + 1;
  if (iVar115 == 1) {
    uVar114 = (uint)(iVar119 != 1);
  }
  if (this->verbose != 0 || iVar115 != 1) {
    pcVar110 = "false";
    if (iVar115 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--arenacompact=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->arenacompact == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar119 = this->arenasort;
  if (iVar119 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar119 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--arenasort=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->arenasort == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar115 = this->arenatype;
  if (iVar115 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--arenatype=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->arenatype == 3) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar109 = this->binary;
  if (iVar109 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar109 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--binary=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->binary == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar1 = this->block;
  if (this->verbose != 0 || iVar1 != 0) {
    pcVar110 = "true";
    if (iVar1 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--block=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->block == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar2 = this->blockmaxclslim;
  if (iVar2 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockmaxclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->blockmaxclslim == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar3 = this->blockminclslim;
  if (iVar3 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockminclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->blockminclslim == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar4 = this->blockocclim;
  if (iVar4 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--blockocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->blockocclim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar5 = this->bump;
  if (iVar5 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar5 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--bump=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->bump == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar6 = this->bumpreason;
  if (iVar6 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar6 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--bumpreason=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->bumpreason == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar7 = this->bumpreasondepth;
  if (iVar7 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--bumpreasondepth=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->bumpreasondepth == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar8 = this->check;
  if (this->verbose != 0 || iVar8 != 0) {
    pcVar110 = "true";
    if (iVar8 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--check=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->check == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar9 = this->checkassumptions;
  if (iVar9 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar9 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--checkassumptions=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->checkassumptions == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar10 = this->checkconstraint;
  if (iVar10 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar10 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--checkconstraint=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->checkconstraint == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar11 = this->checkfailed;
  if (iVar11 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar11 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--checkfailed=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->checkfailed == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar12 = this->checkfrozen;
  if (this->verbose != 0 || iVar12 != 0) {
    pcVar110 = "true";
    if (iVar12 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--checkfrozen=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->checkfrozen == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar13 = this->checkproof;
  if (iVar13 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--checkproof=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->checkproof == 3) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar14 = this->checkwitness;
  if (iVar14 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar14 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--checkwitness=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->checkwitness == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar15 = this->chrono;
  if (iVar15 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--chrono=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->chrono == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar16 = this->chronoalways;
  if (this->verbose != 0 || iVar16 != 0) {
    pcVar110 = "true";
    if (iVar16 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--chronoalways=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->chronoalways == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar17 = this->chronolevelim;
  if (iVar17 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--chronolevelim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->chronolevelim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar18 = this->chronoreusetrail;
  if (iVar18 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar18 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--chronoreusetrail=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->chronoreusetrail == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar19 = this->compact;
  if (iVar19 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar19 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--compact=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->compact == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar20 = this->compactint;
  if (iVar20 != 2000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->compactint == 2000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar21 = this->compactlim;
  if (iVar21 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->compactlim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar22 = this->compactmin;
  if (iVar22 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--compactmin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->compactmin == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar23 = this->condition;
  if (this->verbose != 0 || iVar23 != 0) {
    pcVar110 = "true";
    if (iVar23 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--condition=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->condition == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar24 = this->conditionint;
  if (iVar24 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->conditionint == 10000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar25 = this->conditionmaxeff;
  if (iVar25 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->conditionmaxeff == 10000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar26 = this->conditionmaxrat;
  if (iVar26 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmaxrat=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->conditionmaxrat == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'100\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar27 = this->conditionmineff;
  if (iVar27 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->conditionmineff == 1000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar28 = this->conditionreleff;
  if (iVar28 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--conditionreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->conditionreleff == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'100\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar29 = this->cover;
  if (this->verbose != 0 || iVar29 != 0) {
    pcVar110 = "true";
    if (iVar29 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--cover=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->cover == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar30 = this->covermaxclslim;
  if (iVar30 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermaxclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->covermaxclslim == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar31 = this->covermaxeff;
  if (iVar31 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->covermaxeff == 100000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar32 = this->coverminclslim;
  if (iVar32 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--coverminclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->coverminclslim == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar33 = this->covermineff;
  if (iVar33 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--covermineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->covermineff == 1000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar34 = this->coverreleff;
  if (iVar34 != 4 || this->verbose != 0) {
    snprintf(buffer,0x100,"--coverreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->coverreleff == 4) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'4\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar35 = this->decompose;
  if (iVar35 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar35 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--decompose=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->decompose == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar36 = this->decomposerounds;
  if (iVar36 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--decomposerounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->decomposerounds == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar37 = this->deduplicate;
  if (iVar37 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar37 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--deduplicate=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->deduplicate == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar38 = this->eagersubsume;
  if (iVar38 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar38 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--eagersubsume=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->eagersubsume == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar39 = this->eagersubsumelim;
  if (iVar39 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--eagersubsumelim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->eagersubsumelim == 0x14) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar40 = this->elim;
  if (iVar40 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar40 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elim=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elim == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar41 = this->elimands;
  if (iVar41 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar41 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimands=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimands == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar42 = this->elimaxeff;
  if (iVar42 != 2000000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimaxeff == 2000000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e9\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar43 = this->elimbackward;
  if (iVar43 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar43 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimbackward=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimbackward == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar44 = this->elimboundmax;
  if (iVar44 != 0x10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimboundmax=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimboundmax == 0x10) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'16\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar45 = this->elimboundmin;
  if (this->verbose != 0 || iVar45 != 0) {
    snprintf(buffer,0x100,"--elimboundmin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimboundmin == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,pcVar113
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar46 = this->elimclslim;
  if (iVar46 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimclslim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar47 = this->elimequivs;
  if (iVar47 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar47 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimequivs=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimequivs == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar48 = this->elimineff;
  if (iVar48 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimineff == 10000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar49 = this->elimint;
  if (iVar49 != 2000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimint == 2000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar50 = this->elimites;
  if (iVar50 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar50 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimites=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimites == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar51 = this->elimlimited;
  if (iVar51 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar51 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimlimited=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimlimited == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar52 = this->elimocclim;
  if (iVar52 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimocclim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar53 = this->elimprod;
  if (iVar53 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimprod=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimprod == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar54 = this->elimreleff;
  if (iVar54 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimreleff == 1000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar55 = this->elimrounds;
  if (iVar55 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimrounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimrounds == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar56 = this->elimsubst;
  if (iVar56 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar56 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimsubst=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimsubst == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar57 = this->elimsum;
  if (iVar57 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimsum=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimsum == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar58 = this->elimxorlim;
  if (iVar58 != 5 || this->verbose != 0) {
    snprintf(buffer,0x100,"--elimxorlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimxorlim == 5) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'5\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar59 = this->elimxors;
  if (iVar59 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar59 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--elimxors=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->elimxors == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar60 = this->emagluefast;
  if (iVar60 != 0x21 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emagluefast=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->emagluefast == 0x21) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'33\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar61 = this->emaglueslow;
  if (iVar61 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emaglueslow=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->emaglueslow == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar62 = this->emajump;
  if (iVar62 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emajump=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->emajump == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar63 = this->emalevel;
  if (iVar63 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emalevel=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->emalevel == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar64 = this->emasize;
  if (iVar64 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--emasize=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->emasize == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar65 = this->ematrailfast;
  if (iVar65 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ematrailfast=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ematrailfast == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar66 = this->ematrailslow;
  if (iVar66 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ematrailslow=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ematrailslow == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar67 = this->exteagerreasons;
  if (iVar67 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar67 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--exteagerreasons=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->exteagerreasons == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar68 = this->exteagerrecalc;
  if (iVar68 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar68 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--exteagerrecalc=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->exteagerrecalc == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar69 = this->externallrat;
  if (this->verbose != 0 || iVar69 != 0) {
    pcVar110 = "true";
    if (iVar69 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--externallrat=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->externallrat == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar70 = this->flush;
  if (this->verbose != 0 || iVar70 != 0) {
    pcVar110 = "true";
    if (iVar70 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--flush=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->flush == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar71 = this->flushfactor;
  if (iVar71 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--flushfactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->flushfactor == 3) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar72 = this->flushint;
  if (iVar72 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--flushint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->flushint == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar73 = this->forcephase;
  if (this->verbose != 0 || iVar73 != 0) {
    pcVar110 = "true";
    if (iVar73 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--forcephase=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->forcephase == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar74 = this->frat;
  if (this->verbose != 0 || iVar74 != 0) {
    snprintf(buffer,0x100,"--frat=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->frat == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,pcVar113
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar75 = this->idrup;
  if (this->verbose != 0 || iVar75 != 0) {
    pcVar110 = "true";
    if (iVar75 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--idrup=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->idrup == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar76 = this->ilb;
  if (this->verbose != 0 || iVar76 != 0) {
    pcVar110 = "true";
    if (iVar76 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--ilb=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ilb == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar77 = this->ilbassumptions;
  if (this->verbose != 0 || iVar77 != 0) {
    pcVar110 = "true";
    if (iVar77 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--ilbassumptions=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ilbassumptions == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar78 = this->inprocessing;
  if (iVar78 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar78 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--inprocessing=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->inprocessing == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar79 = this->instantiate;
  if (this->verbose != 0 || iVar79 != 0) {
    pcVar110 = "true";
    if (iVar79 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--instantiate=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->instantiate == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar80 = this->instantiateclslim;
  if (iVar80 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--instantiateclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->instantiateclslim == 3) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar81 = this->instantiateocclim;
  if (iVar81 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--instantiateocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->instantiateocclim == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar82 = this->instantiateonce;
  if (iVar82 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar82 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--instantiateonce=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->instantiateonce == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar83 = this->lidrup;
  if (this->verbose != 0 || iVar83 != 0) {
    pcVar110 = "true";
    if (iVar83 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--lidrup=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->lidrup == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar84 = this->lrat;
  if (this->verbose != 0 || iVar84 != 0) {
    pcVar110 = "true";
    if (iVar84 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--lrat=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->lrat == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar85 = this->lucky;
  if (iVar85 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar85 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--lucky=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->lucky == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar86 = this->minimize;
  if (iVar86 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar86 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--minimize=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->minimize == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar87 = this->minimizedepth;
  if (iVar87 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--minimizedepth=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->minimizedepth == 1000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar88 = this->otfs;
  if (iVar88 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar88 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--otfs=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->otfs == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar89 = this->phase;
  if (iVar89 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar89 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--phase=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->phase == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar90 = this->probe;
  if (iVar90 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar90 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--probe=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->probe == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar91 = this->probehbr;
  if (iVar91 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar91 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--probehbr=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->probehbr == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar92 = this->probeint;
  if (iVar92 != 5000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->probeint == 5000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'5e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar93 = this->probemaxeff;
  if (iVar93 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probemaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->probemaxeff == 100000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar94 = this->probemineff;
  if (iVar94 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probemineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->probemineff == 1000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar95 = this->probereleff;
  if (iVar95 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--probereleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->probereleff == 0x14) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar96 = this->proberounds;
  if (iVar96 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--proberounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->proberounds == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar97 = this->profile;
  if (iVar97 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--profile=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->profile == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar98 = this->quiet;
  if (this->verbose != 0 || iVar98 != 0) {
    pcVar110 = "true";
    if (iVar98 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--quiet=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->quiet == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar99 = this->radixsortlim;
  if (iVar99 != 0x20 || this->verbose != 0) {
    snprintf(buffer,0x100,"--radixsortlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->radixsortlim == 0x20) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'32\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar100 = this->realtime;
  if (this->verbose != 0 || iVar100 != 0) {
    pcVar110 = "true";
    if (iVar100 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--realtime=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->realtime == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar101 = this->reduce;
  if (iVar101 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar101 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--reduce=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reduce == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar102 = this->reduceint;
  if (iVar102 != 300 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reduceint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reduceint == 300) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'300\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar103 = this->reducetarget;
  if (iVar103 != 0x4b || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetarget=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reducetarget == 0x4b) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'75\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar104 = this->reducetier1glue;
  if (iVar104 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetier1glue=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reducetier1glue == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar105 = this->reducetier2glue;
  if (iVar105 != 6 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reducetier2glue=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reducetier2glue == 6) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'6\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar106 = this->reluctant;
  if (iVar106 != 0x400 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reluctant=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reluctant == 0x400) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1024\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar107 = this->reluctantmax;
  if (iVar107 != 0x100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--reluctantmax=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reluctantmax == 0x100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1048576\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar108 = this->rephase;
  if (iVar108 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar108 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--rephase=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->rephase == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar115 = ((((((((((((((((((((((((((((((((uVar114 + (iVar119 != 1) + (uint)(iVar115 != 3) +
                                           (uint)(iVar109 != 1)) - (uint)(iVar1 == 0)) +
                                          (uint)(iVar2 != 100000) + (uint)(iVar3 != 2) +
                                          (uint)(iVar4 != 100) + (uint)(iVar5 != 1) +
                                          (uint)(iVar6 != 1) + (uint)(iVar7 != 1)) -
                                        (uint)(iVar8 == 0)) + (uint)(iVar9 != 1) +
                                        (uint)(iVar10 != 1) + (uint)(iVar11 != 1)) -
                                      (uint)(iVar12 == 0)) + (uint)(iVar13 != 3) +
                                      (uint)(iVar14 != 1) + (uint)(iVar15 != 1)) -
                                    (uint)(iVar16 == 0)) + (uint)(iVar17 != 100) +
                                    (uint)(iVar18 != 1) + (uint)(iVar19 != 1) +
                                    (uint)(iVar20 != 2000) + (uint)(iVar21 != 100) +
                                   (uint)(iVar22 != 100)) - (uint)(iVar23 == 0)) +
                                  (uint)(iVar24 != 10000) + (uint)(iVar25 != 10000000) +
                                  (uint)(iVar26 != 100) + (uint)(iVar27 != 1000000) +
                                 (uint)(iVar28 != 100)) - (uint)(iVar29 == 0)) +
                                (uint)(iVar30 != 100000) + (uint)(iVar31 != 100000000) +
                                (uint)(iVar32 != 2) + (uint)(iVar33 != 1000000) +
                                (uint)(iVar34 != 4) + (uint)(iVar35 != 1) + (uint)(iVar36 != 2) +
                                (uint)(iVar37 != 1) + (uint)(iVar38 != 1) + (uint)(iVar39 != 0x14) +
                                (uint)(iVar40 != 1) + (uint)(iVar41 != 1) +
                                (uint)(iVar42 != 2000000000) + (uint)(iVar43 != 1) +
                               (uint)(iVar44 != 0x10)) - (uint)(iVar45 == 0)) +
                              (uint)(iVar46 != 100) + (uint)(iVar47 != 1) +
                              (uint)(iVar48 != 10000000) + (uint)(iVar49 != 2000) +
                              (uint)(iVar50 != 1) + (uint)(iVar51 != 1) + (uint)(iVar52 != 100) +
                              (uint)(iVar53 != 1) + (uint)(iVar54 != 1000) + (uint)(iVar55 != 2) +
                              (uint)(iVar56 != 1) + (uint)(iVar57 != 1) + (uint)(iVar58 != 5) +
                              (uint)(iVar59 != 1) + (uint)(iVar60 != 0x21) +
                              (uint)(iVar61 != 100000) + (uint)(iVar62 != 100000) +
                              (uint)(iVar63 != 100000) + (uint)(iVar64 != 100000) +
                              (uint)(iVar65 != 100) + (uint)(iVar66 != 100000) + (uint)(iVar67 != 1)
                             + (uint)(iVar68 != 1)) - (uint)(iVar69 == 0)) - (uint)(iVar70 == 0)) +
                           (uint)(iVar71 != 3) + (uint)(iVar72 != 100000)) - (uint)(iVar73 == 0)) -
                        (uint)(iVar74 == 0)) - (uint)(iVar75 == 0)) - (uint)(iVar76 == 0)) -
                     (uint)(iVar77 == 0)) + (uint)(iVar78 != 1)) - (uint)(iVar79 == 0)) +
                   (uint)(iVar80 != 3) + (uint)(iVar81 != 1) + (uint)(iVar82 != 1)) -
                 (uint)(iVar83 == 0)) - (uint)(iVar84 == 0)) + (uint)(iVar85 != 1) +
                (uint)(iVar86 != 1) + (uint)(iVar87 != 1000) + (uint)(iVar88 != 1) +
                (uint)(iVar89 != 1) + (uint)(iVar90 != 1) + (uint)(iVar91 != 1) +
                (uint)(iVar92 != 5000) + (uint)(iVar93 != 100000000) + (uint)(iVar94 != 1000000) +
                (uint)(iVar95 != 0x14) + (uint)(iVar96 != 1) + (uint)(iVar97 != 2)) -
              (uint)(iVar98 == 0)) + (uint)(iVar99 != 0x20) + 0x13) - (uint)(iVar100 == 0)) +
            (uint)(iVar101 != 1) + (uint)(iVar102 != 300) + (uint)(iVar103 != 0x4b) +
            (uint)(iVar104 != 2) + (uint)(iVar105 != 6) + (uint)(iVar106 != 0x400) +
            (uint)(iVar107 != 0x100000) + (uint)(iVar108 != 1);
  iVar119 = this->rephaseint;
  if (iVar119 == 1000 && this->verbose == 0) {
    iVar109 = this->report;
    if (iVar109 == reportdefault) goto LAB_00828122;
    iVar115 = iVar115 + 1;
  }
  else {
    snprintf(buffer,0x100,"--rephaseint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->rephaseint == 1000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
    iVar109 = this->report;
    iVar115 = iVar115 + (uint)(iVar119 != 1000) + (uint)(iVar109 != reportdefault);
    if (iVar109 == reportdefault && this->verbose == 0) goto LAB_00828122;
  }
  pcVar113 = "true";
  pcVar110 = "true";
  if (iVar109 == 0) {
    pcVar110 = "false";
  }
  snprintf(buffer,0x100,"--report=%s",pcVar110);
  if (this->internal != (Internal *)0x0) {
    pcVar110 = "\x1b[0m";
    if (tout[9] == '\0') {
      pcVar110 = "";
    }
    if (this->report == reportdefault) {
      pcVar117 = "same as";
      pcVar116 = "\x1b[0;32m";
      pcVar112 = "";
      pcVar111 = "";
    }
    else {
      pcVar112 = "";
      if (tout[9] != '\0') {
        pcVar112 = "\x1b[1;33m";
      }
      pcVar117 = "different from";
      pcVar116 = "\x1b[0;33m";
      pcVar111 = pcVar110;
    }
    pcVar118 = "";
    if (tout[9] != '\0') {
      pcVar118 = pcVar116;
    }
    if (reportdefault == 0) {
      pcVar113 = "false";
    }
    Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar112,buffer,pcVar111,
                      pcVar117,pcVar118,pcVar113,pcVar110);
  }
LAB_00828122:
  iVar119 = this->reportall;
  if (this->verbose != 0 || iVar119 != 0) {
    pcVar110 = "true";
    if (iVar119 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--reportall=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reportall == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar109 = this->reportsolve;
  if (this->verbose != 0 || iVar109 != 0) {
    pcVar110 = "true";
    if (iVar109 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--reportsolve=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reportsolve == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar1 = this->restart;
  if (iVar1 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar1 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--restart=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->restart == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar2 = this->restartint;
  if (iVar2 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--restartint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->restartint == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar3 = this->restartmargin;
  if (iVar3 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--restartmargin=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->restartmargin == 10) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar4 = this->restartreusetrail;
  if (iVar4 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar4 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--restartreusetrail=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->restartreusetrail == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar5 = this->restoreall;
  if (this->verbose != 0 || iVar5 != 0) {
    snprintf(buffer,0x100,"--restoreall=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->restoreall == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,pcVar113
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar6 = this->restoreflush;
  if (this->verbose != 0 || iVar6 != 0) {
    pcVar110 = "true";
    if (iVar6 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--restoreflush=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->restoreflush == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar7 = this->reverse;
  if (this->verbose != 0 || iVar7 != 0) {
    pcVar110 = "true";
    if (iVar7 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--reverse=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->reverse == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar8 = this->score;
  if (iVar8 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar8 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--score=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->score == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar9 = this->scorefactor;
  if (iVar9 != 0x3b6 || this->verbose != 0) {
    snprintf(buffer,0x100,"--scorefactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->scorefactor == 0x3b6) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'950\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar10 = this->seed;
  if (this->verbose != 0 || iVar10 != 0) {
    snprintf(buffer,0x100,"--seed=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->seed == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,pcVar113
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar11 = this->shrink;
  if (iVar11 != 3 || this->verbose != 0) {
    snprintf(buffer,0x100,"--shrink=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->shrink == 3) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'3\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar12 = this->shrinkreap;
  if (iVar12 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar12 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--shrinkreap=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->shrinkreap == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar13 = this->shuffle;
  if (this->verbose != 0 || iVar13 != 0) {
    pcVar110 = "true";
    if (iVar13 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--shuffle=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->shuffle == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar14 = this->shufflequeue;
  if (iVar14 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar14 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--shufflequeue=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->shufflequeue == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar15 = this->shufflerandom;
  if (this->verbose != 0 || iVar15 != 0) {
    pcVar110 = "true";
    if (iVar15 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--shufflerandom=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->shufflerandom == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar16 = this->shufflescores;
  if (iVar16 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar16 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--shufflescores=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->shufflescores == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar17 = this->stabilize;
  if (iVar17 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar17 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--stabilize=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->stabilize == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar18 = this->stabilizefactor;
  if (iVar18 != 200 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizefactor=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->stabilizefactor == 200) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'200\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar19 = this->stabilizeint;
  if (iVar19 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->stabilizeint == 1000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar20 = this->stabilizemaxint;
  if (iVar20 != 2000000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--stabilizemaxint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->stabilizemaxint == 2000000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e9\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar21 = this->stabilizeonly;
  if (this->verbose != 0 || iVar21 != 0) {
    pcVar110 = "true";
    if (iVar21 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--stabilizeonly=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->stabilizeonly == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar22 = this->stats;
  if (this->verbose != 0 || iVar22 != 0) {
    pcVar110 = "true";
    if (iVar22 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--stats=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->stats == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar23 = this->subsume;
  if (iVar23 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar23 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--subsume=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsume == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar24 = this->subsumebinlim;
  if (iVar24 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumebinlim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumebinlim == 10000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar25 = this->subsumeclslim;
  if (iVar25 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeclslim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumeclslim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar26 = this->subsumeint;
  if (iVar26 != 10000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumeint == 10000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e4\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar27 = this->subsumelimited;
  if (iVar27 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar27 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--subsumelimited=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumelimited == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar28 = this->subsumemaxeff;
  if (iVar28 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumemaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumemaxeff == 100000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar29 = this->subsumemineff;
  if (iVar29 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumemineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumemineff == 1000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar30 = this->subsumeocclim;
  if (iVar30 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumeocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumeocclim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar31 = this->subsumereleff;
  if (iVar31 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--subsumereleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumereleff == 1000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar32 = this->subsumestr;
  if (iVar32 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar32 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--subsumestr=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->subsumestr == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar33 = this->target;
  if (iVar33 != 1 || this->verbose != 0) {
    snprintf(buffer,0x100,"--target=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->target == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar34 = this->terminateint;
  if (iVar34 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--terminateint=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->terminateint == 10) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar35 = this->ternary;
  if (iVar35 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar35 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--ternary=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternary == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar36 = this->ternarymaxadd;
  if (iVar36 != 1000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymaxadd=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternarymaxadd == 1000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e3\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar37 = this->ternarymaxeff;
  if (iVar37 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternarymaxeff == 100000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar38 = this->ternarymineff;
  if (iVar38 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternarymineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternarymineff == 1000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar39 = this->ternaryocclim;
  if (iVar39 != 100 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryocclim=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternaryocclim == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar40 = this->ternaryreleff;
  if (iVar40 != 10 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternaryreleff == 10) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'10\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar41 = this->ternaryrounds;
  if (iVar41 != 2 || this->verbose != 0) {
    snprintf(buffer,0x100,"--ternaryrounds=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->ternaryrounds == 2) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2\'%s)",pcVar113,buffer,pcVar112
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar42 = this->transred;
  if (iVar42 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar42 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--transred=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->transred == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar43 = this->transredmaxeff;
  if (iVar43 != 100000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->transredmaxeff == 100000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e8\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar44 = this->transredmineff;
  if (iVar44 != 1000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--transredmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->transredmineff == 1000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e6\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar115 = ((((((((((((((((iVar115 - (uint)(iVar119 == 0)) - (uint)(iVar109 == 0)) +
                          (uint)(iVar1 != 1) + (uint)(iVar2 != 2) + (uint)(iVar3 != 10) +
                         (uint)(iVar4 != 1)) - (uint)(iVar5 == 0)) - (uint)(iVar6 == 0)) + 10) -
                     (uint)(iVar7 == 0)) + (uint)(iVar8 != 1) + (uint)(iVar9 != 0x3b6)) -
                   (uint)(iVar10 == 0)) + (uint)(iVar11 != 3) + (uint)(iVar12 != 1)) -
                 (uint)(iVar13 == 0)) + (uint)(iVar14 != 1)) - (uint)(iVar15 == 0)) +
               (uint)(iVar16 != 1) + (uint)(iVar17 != 1) + (uint)(iVar18 != 200) +
               (uint)(iVar19 != 1000) + (uint)(iVar20 != 2000000000)) - (uint)(iVar21 == 0)) -
            (uint)(iVar22 == 0)) + (uint)(iVar23 != 1) + (uint)(iVar24 != 10000) +
            (uint)(iVar25 != 100) + (uint)(iVar26 != 10000) + (uint)(iVar27 != 1) +
            (uint)(iVar28 != 100000000) + (uint)(iVar29 != 1000000) + (uint)(iVar30 != 100) +
            (uint)(iVar31 != 1000) + (uint)(iVar32 != 1) + (uint)(iVar33 != 1) +
            (uint)(iVar34 != 10) + (uint)(iVar35 != 1) + (uint)(iVar36 != 1000) +
            (uint)(iVar37 != 100000000) + (uint)(iVar38 != 1000000) + (uint)(iVar39 != 100) +
            (uint)(iVar40 != 10) + (uint)(iVar41 != 2) + (uint)(iVar42 != 1) +
            (uint)(iVar43 != 100000000) + (uint)(iVar44 != 1000000) +
            (uint)(this->transredreleff != 100);
  iVar119 = 0;
  if (this->transredreleff != 100 || this->verbose != 0) {
    iVar119 = 0;
    snprintf(buffer,0x100,"--transredreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->transredreleff == 100) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e2\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
    if (this->verbose != 0) {
      iVar115 = iVar115 + 1;
      snprintf(buffer,0x100,"--verbose=%d");
      iVar119 = this->verbose;
      if (this->internal != (Internal *)0x0) {
        pcVar110 = "\x1b[0m";
        if (tout[9] == '\0') {
          pcVar110 = "";
        }
        if (iVar119 == 0) {
          pcVar116 = "same as";
          pcVar112 = "\x1b[0;32m";
          pcVar113 = "";
          pcVar111 = "";
        }
        else {
          pcVar111 = "";
          if (tout[9] != '\0') {
            pcVar111 = "\x1b[1;33m";
          }
          pcVar116 = "different from";
          pcVar112 = "\x1b[0;33m";
          pcVar113 = pcVar110;
        }
        pcVar117 = "";
        if (tout[9] != '\0') {
          pcVar117 = pcVar112;
        }
        Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,
                          pcVar113,pcVar116,pcVar117,pcVar110);
        iVar119 = this->verbose;
      }
    }
  }
  iVar109 = this->veripb;
  if (iVar119 != 0 || iVar109 != 0) {
    snprintf(buffer,0x100,"--veripb=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->veripb == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,pcVar113
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar119 = this->vivify;
  if (iVar119 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar119 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--vivify=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivify == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar1 = this->vivifyinst;
  if (iVar1 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar1 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--vivifyinst=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivifyinst == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar2 = this->vivifymaxeff;
  if (iVar2 != 20000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifymaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivifymaxeff == 20000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e7\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar3 = this->vivifymineff;
  if (iVar3 != 20000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifymineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivifymineff == 20000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'2e4\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar4 = this->vivifyonce;
  if (this->verbose != 0 || iVar4 != 0) {
    snprintf(buffer,0x100,"--vivifyonce=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivifyonce == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'0\'%s)",pcVar111,buffer,pcVar113
                        ,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar5 = this->vivifyredeff;
  if (iVar5 != 0x4b || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifyredeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivifyredeff == 0x4b) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'75\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar6 = this->vivifyreleff;
  if (iVar6 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--vivifyreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->vivifyreleff == 0x14) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar7 = this->walk;
  if (iVar7 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar7 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--walk=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->walk == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar8 = this->walkmaxeff;
  if (iVar8 != 10000000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkmaxeff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->walkmaxeff == 10000000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e7\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar9 = this->walkmineff;
  if (iVar9 != 100000 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkmineff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->walkmineff == 100000) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'1e5\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  iVar10 = this->walknonstable;
  if (iVar10 != 1 || this->verbose != 0) {
    pcVar110 = "false";
    if (iVar10 != 0) {
      pcVar110 = "true";
    }
    snprintf(buffer,0x100,"--walknonstable=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->walknonstable == 1) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,"true",pcVar110);
    }
  }
  iVar11 = this->walkredundant;
  if (this->verbose != 0 || iVar11 != 0) {
    pcVar110 = "true";
    if (iVar11 == 0) {
      pcVar110 = "false";
    }
    snprintf(buffer,0x100,"--walkredundant=%s",pcVar110);
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->walkredundant == 0) {
        pcVar116 = "same as";
        pcVar112 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar111 = "";
      }
      else {
        pcVar111 = "";
        if (tout[9] != '\0') {
          pcVar111 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar112 = "\x1b[0;33m";
        pcVar113 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar112;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'%s\'%s)",pcVar111,buffer,
                        pcVar113,pcVar116,pcVar117,"false",pcVar110);
    }
  }
  iVar12 = this->walkreleff;
  if (iVar12 != 0x14 || this->verbose != 0) {
    snprintf(buffer,0x100,"--walkreleff=%d");
    if (this->internal != (Internal *)0x0) {
      pcVar110 = "\x1b[0m";
      if (tout[9] == '\0') {
        pcVar110 = "";
      }
      if (this->walkreleff == 0x14) {
        pcVar116 = "same as";
        pcVar111 = "\x1b[0;32m";
        pcVar113 = "";
        pcVar112 = "";
      }
      else {
        pcVar113 = "";
        if (tout[9] != '\0') {
          pcVar113 = "\x1b[1;33m";
        }
        pcVar116 = "different from";
        pcVar111 = "\x1b[0;33m";
        pcVar112 = pcVar110;
      }
      pcVar117 = "";
      if (tout[9] != '\0') {
        pcVar117 = pcVar111;
      }
      Internal::message(this->internal,"  %s%-30s%s (%s default %s\'20\'%s)",pcVar113,buffer,
                        pcVar112,pcVar116,pcVar117,pcVar110);
    }
  }
  if (((((iVar115 - (uint)(iVar109 == 0)) + (uint)(iVar119 != 1) + (uint)(iVar1 != 1) +
         (uint)(iVar2 != 20000000) + (uint)(iVar3 != 20000) + 3) - (uint)(iVar4 == 0)) +
       (uint)(iVar5 != 0x4b) + (uint)(iVar6 != 0x14) + (uint)(iVar7 != 1) +
       (uint)(iVar8 != 10000000) + (uint)(iVar9 != 100000) + (uint)(iVar10 != 1) ==
       (uint)(iVar11 == 0) && iVar12 == 0x14) && (this->internal != (Internal *)0x0)) {
    Internal::message(this->internal,"all options are set to their default value");
  }
  return;
}

Assistant:

void Options::print () {
  unsigned different = 0;
#ifdef QUIET
  const bool verbose = false;
#endif
  char buffer[256];
  // We prefer the macro iteration here since '[VLH]' might be '1e9' etc.
#define OPTION(N, V, L, H, O, P, R, D) \
  if (N != (V)) \
    different++; \
  if (verbose || N != (V)) { \
    if ((L) == 0 && (H) == 1) { \
      snprintf (buffer, sizeof buffer, "--" #N "=%s", \
                (N ? "true" : "false")); \
      MSG ("  %s%-30s%s (%s default %s'%s'%s)", \
           ((N == (V)) ? "" : tout.bright_yellow_code ()), buffer, \
           ((N == (V)) ? "" : tout.normal_code ()), \
           ((N == (V)) ? "same as" : "different from"), \
           ((N == (V)) ? tout.green_code () : tout.yellow_code ()), \
           (bool) (V) ? "true" : "false", tout.normal_code ()); \
    } else { \
      snprintf (buffer, sizeof buffer, "--" #N "=%d", N); \
      MSG ("  %s%-30s%s (%s default %s'" #V "'%s)", \
           ((N == (V)) ? "" : tout.bright_yellow_code ()), buffer, \
           ((N == (V)) ? "" : tout.normal_code ()), \
           ((N == (V)) ? "same as" : "different from"), \
           ((N == (V)) ? tout.green_code () : tout.yellow_code ()), \
           tout.normal_code ()); \
    } \
  }
  OPTIONS
#undef OPTION
  if (!different)
    MSG ("all options are set to their default value");
}